

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

ssh_ttymodes *
read_ttymodes_from_packet(ssh_ttymodes *__return_storage_ptr__,BinarySource *bs,int ssh_version)

{
  byte bVar1;
  uint real_opcode_00;
  uint uVar2;
  unsigned_long uVar3;
  uint our_opcode;
  uint real_opcode;
  int ssh_version_local;
  BinarySource *bs_local;
  
  memset(__return_storage_ptr__,0,0x50c);
  while( true ) {
    bVar1 = BinarySource_get_byte(bs->binarysource_);
    real_opcode_00 = (uint)bVar1;
    if ((real_opcode_00 == 0) || (0x9f < real_opcode_00)) break;
    uVar2 = our_ttymode_opcode(real_opcode_00,ssh_version);
    if (0x101 < uVar2) {
      __assert_fail("our_opcode < TTYMODE_LIMIT",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/common.c"
                    ,0x217,"struct ssh_ttymodes read_ttymodes_from_packet(BinarySource *, int)");
    }
    __return_storage_ptr__->have_mode[uVar2] = true;
    if (((ssh_version == 1) && (real_opcode_00 != 0)) && (real_opcode_00 < 0x80)) {
      bVar1 = BinarySource_get_byte(bs->binarysource_);
      __return_storage_ptr__->mode_val[uVar2] = (uint)bVar1;
    }
    else {
      uVar3 = BinarySource_get_uint32(bs->binarysource_);
      __return_storage_ptr__->mode_val[uVar2] = (uint)uVar3;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

struct ssh_ttymodes read_ttymodes_from_packet(
    BinarySource *bs, int ssh_version)
{
    struct ssh_ttymodes modes;
    memset(&modes, 0, sizeof(modes));

    while (1) {
        unsigned real_opcode, our_opcode;

        real_opcode = get_byte(bs);
        if (real_opcode == TTYMODE_END_OF_LIST)
            break;
        if (real_opcode >= 160) {
            /*
             * RFC 4254 (and the SSH 1.5 spec): "Opcodes 160 to 255
             * are not yet defined, and cause parsing to stop (they
             * should only be used after any other data)."
             *
             * My interpretation of this is that if one of these
             * opcodes appears, it's not a parse _error_, but it is
             * something that we don't know how to parse even well
             * enough to step over it to find the next opcode, so we
             * stop parsing now and assume that the rest of the string
             * is composed entirely of things we don't understand and
             * (as usual for unsupported terminal modes) silently
             * ignore.
             */
            return modes;
        }

        our_opcode = our_ttymode_opcode(real_opcode, ssh_version);
        assert(our_opcode < TTYMODE_LIMIT);
        modes.have_mode[our_opcode] = true;

        if (ssh_version == 1 && real_opcode >= 1 && real_opcode <= 127)
            modes.mode_val[our_opcode] = get_byte(bs);
        else
            modes.mode_val[our_opcode] = get_uint32(bs);
    }

    return modes;
}